

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

ImPlotColormap ImPlot::AddColormap(char *name,ImU32 *colormap,int size,bool qual)

{
  ImPlotContext *pIVar1;
  ImPlotColormap IVar2;
  int iVar3;
  ImPlotContext *gp;
  bool qual_local;
  int size_local;
  ImU32 *colormap_local;
  char *name_local;
  
  pIVar1 = GImPlot;
  if (size < 2) {
    __assert_fail("(size > 1) && \"The colormap size must be greater than 1!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xd02,
                  "ImPlotColormap ImPlot::AddColormap(const char *, const ImU32 *, int, bool)");
  }
  IVar2 = ImPlotColormapData::GetIndex(&GImPlot->ColormapData,name);
  if (IVar2 != -1) {
    __assert_fail("(gp.ColormapData.GetIndex(name) == -1) && \"The colormap name has already be used!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xd03,
                  "ImPlotColormap ImPlot::AddColormap(const char *, const ImU32 *, int, bool)");
  }
  iVar3 = ImPlotColormapData::Append(&pIVar1->ColormapData,name,colormap,size,qual);
  return iVar3;
}

Assistant:

ImPlotColormap AddColormap(const char* name, const ImU32*  colormap, int size, bool qual) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(size > 1, "The colormap size must be greater than 1!");
    IM_ASSERT_USER_ERROR(gp.ColormapData.GetIndex(name) == -1, "The colormap name has already be used!");
    return gp.ColormapData.Append(name, colormap, size, qual);
}